

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpnetworkconnection_p.cpp
# Opt level: O0

void QHttpNetworkConnection::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 in_RCX;
  uint in_EDX;
  int in_ESI;
  QHttpNetworkConnectionPrivate *in_RDI;
  QHttpNetworkConnection *_t;
  QHttpNetworkConnectionPrivate *in_stack_00000028;
  
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      onlineStateChanged((QHttpNetworkConnection *)(ulong)in_EDX,SUB81((ulong)in_RCX >> 0x38,0));
      break;
    case 1:
      d_func((QHttpNetworkConnection *)0x2f0f68);
      QHttpNetworkConnectionPrivate::_q_startNextRequest((QHttpNetworkConnectionPrivate *)_a);
      break;
    case 2:
      d_func((QHttpNetworkConnection *)0x2f0f7c);
      QHttpNetworkConnectionPrivate::_q_hostLookupFinished(in_stack_00000028,(QHostInfo *)_o);
      break;
    case 3:
      d_func((QHttpNetworkConnection *)0x2f0f99);
      QHttpNetworkConnectionPrivate::_q_connectDelayedChannel(in_RDI);
    }
  }
  return;
}

Assistant:

void QHttpNetworkConnection::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpNetworkConnection *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->onlineStateChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->d_func()->_q_startNextRequest(); break;
        case 2: _t->d_func()->_q_hostLookupFinished((*reinterpret_cast< std::add_pointer_t<QHostInfo>>(_a[1]))); break;
        case 3: _t->d_func()->_q_connectDelayedChannel(); break;
        default: ;
        }
    }
}